

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O0

MPP_RET mpp_enc_ref_cfg_init(MppEncRefCfg *ref)

{
  undefined8 *puVar1;
  MppEncRefCfgImpl *p;
  MppEncRefCfg *ref_local;
  
  if (ref == (MppEncRefCfg *)0x0) {
    _mpp_log_l(2,"mpp_enc_ref","invalid NULL input ref_cfg\n","mpp_enc_ref_cfg_init");
    ref_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    puVar1 = (undefined8 *)mpp_osal_calloc("mpp_enc_ref_cfg_init",0x58);
    *ref = puVar1;
    if (puVar1 == (undefined8 *)0x0) {
      _mpp_log_l(2,"mpp_enc_ref","malloc failed\n","mpp_enc_ref_cfg_init");
      ref_local._4_4_ = MPP_ERR_NULL_PTR;
    }
    else {
      mpp_env_get_u32("enc_ref_cfg_debug",(RK_U32 *)((long)puVar1 + 0xc),0);
      *puVar1 = module_name;
      ref_local._4_4_ = MPP_OK;
    }
  }
  return ref_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_init(MppEncRefCfg *ref)
{
    if (NULL == ref) {
        mpp_err_f("invalid NULL input ref_cfg\n");
        return MPP_ERR_NULL_PTR;
    }

    MppEncRefCfgImpl *p = mpp_calloc(MppEncRefCfgImpl, 1);
    *ref = p;
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_NULL_PTR;
    }

    mpp_env_get_u32("enc_ref_cfg_debug", &p->debug, 0);

    setup_mpp_enc_ref_cfg(p);

    return MPP_OK;
}